

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

bool qt_isect_curve_horizontal(QBezier *bezier,qreal y,qreal x1,qreal x2,int depth)

{
  bool bVar1;
  int in_ESI;
  long in_FS_OFFSET;
  QBezier *in_XMM0_Qa;
  qreal qVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  qreal lower_bound;
  pair<QBezier,_QBezier> halves;
  QRectF bounds;
  undefined4 in_stack_ffffffffffffff28;
  QBezier *pQVar3;
  QBezier *bezier_00;
  bool local_a9;
  undefined1 local_a8 [64];
  QBezier *in_stack_ffffffffffffff98;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  local_28.w = -NAN;
  local_28.h = -NAN;
  QBezier::bounds(in_XMM0_Qa);
  pQVar3 = in_XMM0_Qa;
  qVar2 = QRectF::top(&local_28);
  if ((((qVar2 <= (double)in_XMM0_Qa) &&
       (bezier_00 = pQVar3, qVar2 = QRectF::bottom(&local_28), (double)pQVar3 < qVar2)) &&
      (qVar2 = QRectF::right(&local_28), in_XMM1_Qa <= qVar2)) &&
     (qVar2 = QRectF::left(&local_28), qVar2 < in_XMM2_Qa)) {
    if ((in_ESI == 0x20) ||
       ((qVar2 = QRectF::width(&local_28), qVar2 < 0.01 &&
        (qVar2 = QRectF::height(&local_28), qVar2 < 0.01)))) {
      local_a9 = true;
      goto LAB_005c281f;
    }
    memset(local_a8,0xff,0x80);
    QBezier::split(in_stack_ffffffffffffff98);
    bVar1 = qt_isect_curve_horizontal
                      (bezier_00,in_XMM1_Qa,in_XMM2_Qa,
                       (qreal)CONCAT44(in_ESI,in_stack_ffffffffffffff28),0x3f847ae1);
    if ((bVar1) ||
       (bVar1 = qt_isect_curve_horizontal
                          (bezier_00,in_XMM1_Qa,in_XMM2_Qa,
                           (qreal)CONCAT44(in_ESI,in_stack_ffffffffffffff28),0x3f847ae1), bVar1)) {
      local_a9 = true;
      goto LAB_005c281f;
    }
  }
  local_a9 = false;
LAB_005c281f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

static bool qt_isect_curve_horizontal(const QBezier &bezier, qreal y, qreal x1, qreal x2, int depth = 0)
{
    QRectF bounds = bezier.bounds();

    if (y >= bounds.top() && y < bounds.bottom()
        && bounds.right() >= x1 && bounds.left() < x2) {
        const qreal lower_bound = qreal(.01);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound))
            return true;

        const auto halves = bezier.split();
        if (qt_isect_curve_horizontal(halves.first, y, x1, x2, depth + 1)
            || qt_isect_curve_horizontal(halves.second, y, x1, x2, depth + 1))
            return true;
    }
    return false;
}